

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string *filename,int fd)

{
  string *this_00;
  pointer pcVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  Slice local_48;
  Slice local_38;
  
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__PosixWritableFile_00116a58;
  this->pos_ = 0;
  this->fd_ = fd;
  uVar3 = std::__cxx11::string::rfind((char)filename,0x2f);
  local_48.size_ = ~uVar3 + filename->_M_string_length;
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_48.data_ = pcVar1 + uVar3 + 1;
  if (uVar3 == 0xffffffffffffffff) {
    local_48.data_ = pcVar1;
  }
  local_38.data_ = "MANIFEST";
  local_38.size_ = 8;
  bVar2 = Slice::starts_with(&local_48,&local_38);
  this->is_manifest_ = bVar2;
  this_00 = &this->filename_;
  std::__cxx11::string::string((string *)this_00,(string *)filename);
  lVar4 = std::__cxx11::string::rfind((char)this_00,0x2f);
  if (lVar4 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&this->dirname_,".",(allocator<char> *)&local_48);
  }
  else {
    std::__cxx11::string::substr((ulong)&this->dirname_,(ulong)this_00);
  }
  return;
}

Assistant:

PosixWritableFile(std::string filename, int fd)
      : pos_(0),
        fd_(fd),
        is_manifest_(IsManifest(filename)),
        filename_(std::move(filename)),
        dirname_(Dirname(filename_)) {}